

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O2

int Vec_PtrPushUnique(Vec_Ptr_t *p,void *Entry)

{
  int iVar1;
  void **ppvVar2;
  ulong uVar3;
  ulong uVar4;
  int nCapMin;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)p->nSize;
  if (p->nSize < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar3 == uVar4) {
      iVar1 = p->nSize;
      if (iVar1 == p->nCap) {
        nCapMin = 0x10;
        if (0xf < iVar1) {
          nCapMin = iVar1 * 2;
        }
        Vec_PtrGrow(p,nCapMin);
      }
      ppvVar2 = p->pArray;
      iVar1 = p->nSize;
      p->nSize = iVar1 + 1;
      ppvVar2[iVar1] = Entry;
      return (int)ppvVar2;
    }
    ppvVar2 = p->pArray + uVar4;
    uVar4 = uVar4 + 1;
  } while (*ppvVar2 != Entry);
  return (int)uVar3;
}

Assistant:

static inline int Vec_PtrPushUnique( Vec_Ptr_t * p, void * Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_PtrPush( p, Entry );
    return 0;
}